

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::ByteSizeLong(TextClassifier *this)

{
  uint32 uVar1;
  ClassLabelsCase CVar2;
  int iVar3;
  long lVar4;
  string *psVar5;
  size_t sVar6;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  TextClassifier *this_local;
  
  sStack_18 = 0;
  language_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = language_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sStack_18 + 1;
  }
  modelparameterdata_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = modelparameterdata_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  uVar1 = revision(this);
  if (uVar1 != 0) {
    uVar1 = revision(this);
    sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar1);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  CVar2 = ClassLabels_case(this);
  if ((CVar2 != CLASSLABELS_NOT_SET) && (CVar2 == kStringClassLabels)) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>
                      ((this->ClassLabels_).stringclasslabels_);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t TextClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.TextClassifier)
  size_t total_size = 0;

  // string language = 10;
  if (this->language().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->language());
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->modelparameterdata());
  }

  // uint32 revision = 1;
  if (this->revision() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->revision());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 200;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}